

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

int trex_parsenumber(TRex *exp)

{
  char *pcVar1;
  ushort **ppuVar2;
  int local_18;
  int local_14;
  int positions;
  int ret;
  TRex *exp_local;
  
  local_14 = *exp->_p + -0x30;
  local_18 = 10;
  exp->_p = exp->_p + 1;
  while( true ) {
    ppuVar2 = __ctype_b_loc();
    if (((*ppuVar2)[(int)*exp->_p] & 0x800) == 0) break;
    pcVar1 = exp->_p;
    exp->_p = pcVar1 + 1;
    local_14 = local_14 * 10 + *pcVar1 + -0x30;
    if (local_18 == 1000000000) {
      trex_error(exp,"overflow in numeric constant");
    }
    local_18 = local_18 * 10;
  }
  return local_14;
}

Assistant:

static int trex_parsenumber(TRex* exp) {
    int ret = *exp->_p - '0';
    int positions = 10;
    exp->_p++;
    while (isdigit((int)(*exp->_p))) {
        ret = ret * 10 + (*exp->_p++ - '0');
        if (positions == 1000000000)
            trex_error(exp, _SC("overflow in numeric constant"));
        positions *= 10;
    };
    return ret;
}